

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_file(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  jx9_vm *pjVar2;
  uint uVar3;
  jx9_io_stream *pStream;
  io_private *pDev;
  jx9_value *pValue;
  jx9_value *pVal;
  void *pvVar4;
  jx9_int64 jVar5;
  ushort **ppuVar6;
  char *pcVar7;
  jx9_value *pResource;
  char *pcVar8;
  char *pcVar9;
  int iErr;
  char *zBuf;
  char *zFile;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar7 = "Expecting a file path";
LAB_00135e46:
    iErr = 2;
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pStream = jx9VmGetStreamDevice(pCtx->pVm,&zFile,nLen);
    if (pStream == (jx9_io_stream *)0x0) {
      pcVar7 = "No such stream device, JX9 is returning FALSE";
      goto LAB_00135e46;
    }
    uVar3 = 0;
    pDev = (io_private *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
    if (pDev != (io_private *)0x0) {
      pjVar2 = pCtx->pVm;
      pDev->pStream = pStream;
      (pDev->sBuffer).pBlob = (void *)0x0;
      (pDev->sBuffer).nByte = 0;
      (pDev->sBuffer).mByte = 0;
      (pDev->sBuffer).pAllocator = &pjVar2->sAllocator;
      (pDev->sBuffer).nFlags = 0;
      pDev->nOfft = 0;
      pDev->iMagic = 0xfeac14;
      if (nArg != 1) {
        uVar3 = jx9_value_to_int(apArg[1]);
      }
      pValue = jx9_context_new_array(pCtx);
      pVal = jx9_context_new_scalar(pCtx);
      pcVar7 = zFile;
      if (pVal != (jx9_value *)0x0 && pValue != (jx9_value *)0x0) {
        if ((uint)nArg < 3) {
          pResource = (jx9_value *)0x0;
        }
        else {
          pResource = apArg[2];
        }
        pvVar4 = jx9StreamOpenHandle(pCtx->pVm,pStream,zFile,1,uVar3 & 1,pResource,0,(int *)0x0);
        pDev->pHandle = pvVar4;
        if (pvVar4 != (void *)0x0) {
LAB_00135f92:
          do {
            jVar5 = StreamReadLine(pDev,&zBuf,-1);
            if (jVar5 < 1) {
              if (pStream->xClose != (_func_void_void_ptr *)0x0) {
                (*pStream->xClose)(pDev->pHandle);
              }
              ReleaseIOPrivate(pCtx,pDev);
              jx9_result_value(pCtx,pValue);
              return 0;
            }
            SyBlobReset(&pVal->sBlob);
            pcVar7 = zBuf;
            pcVar8 = zBuf + jVar5;
            pcVar9 = pcVar8;
            if ((uVar3 & 2) != 0) {
              do {
                pcVar8 = pcVar9;
                if (pcVar8 <= zBuf) break;
                pcVar9 = pcVar8 + -1;
              } while (pcVar8[-1] == '\n');
            }
            pcVar9 = zBuf;
            if ((uVar3 & 4) != 0) {
              do {
                if (pcVar8 <= pcVar9) goto LAB_00135f92;
                cVar1 = *pcVar9;
                if (0xffffffffffffffbf < (ulong)(long)cVar1) break;
                ppuVar6 = __ctype_b_loc();
                pcVar9 = pcVar9 + 1;
              } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
            }
            jx9_value_string(pVal,pcVar7,(int)pcVar8 - (int)pcVar7);
            jx9_array_add_elem(pValue,(jx9_value *)0x0,pVal);
          } while( true );
        }
        jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar7);
        goto LAB_00135e51;
      }
    }
    pcVar7 = "JX9 is running out of memory";
    iErr = 1;
  }
  jx9_context_throw_error(pCtx,iErr,pcVar7);
LAB_00135e51:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_file(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFile, *zPtr, *zEnd, *zBuf;
	jx9_value *pArray, *pLine;
	const jx9_io_stream *pStream;
	int use_include = 0;
	io_private *pDev;
	jx9_int64 n;
	int iFlags;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	iFlags = 0;
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
	}
	if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/ ){
		use_include = TRUE;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pLine = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pLine == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-only mode */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		/* Don't worry about freeing memory, everything will be released automatically
		 * as soon we return from this function.
		 */
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Try to extract a line */
		n = StreamReadLine(pDev, &zBuf, -1);
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pLine);
		/* Remove line ending if requested by the caller */
		zPtr = zBuf;
		zEnd = &zBuf[n];
		if( iFlags & 0x02 /* FILE_IGNORE_NEW_LINES */ ){
			/* Ignore trailig lines */
			while( zPtr < zEnd && (zEnd[-1] == '\n' 
#ifdef __WINNT__
				|| zEnd[-1] == '\r'
#endif
				)){
					n--;
					zEnd--;
			}
		}
		if( iFlags & 0x04 /* FILE_SKIP_EMPTY_LINES */ ){
			/* Ignore empty lines */
			while( zPtr < zEnd && (unsigned char)zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* Empty line */
				continue;
			}
		}
		jx9_value_string(pLine, zBuf, (int)(zEnd-zBuf));
		/* Insert line */
		jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pLine);
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pDev->pHandle);
	/* Release the io_private instance */
	ReleaseIOPrivate(pCtx, pDev);
	/* Return the created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}